

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O2

void cpu_instr_rlc(gb_cpu_t *cpu,uint8_t *value_ptr)

{
  char cVar1;
  uint8_t uVar2;
  
  cVar1 = (char)*value_ptr >> 7;
  uVar2 = *value_ptr * '\x02' - cVar1;
  *value_ptr = uVar2;
  (cpu->field_0).field_0.reg_f =
       cVar1 * -0x10 | (cpu->field_0).field_0.reg_f & 0xf | (uVar2 == '\0') << 7;
  return;
}

Assistant:

static inline void cpu_instr_rlc(gb_cpu_t *cpu, uint8_t *value_ptr)
{
    int msb = *value_ptr >> 7;

    *value_ptr = (*value_ptr << 1) | msb;

    SET_Z(ZERO_CHECK(*value_ptr));
    SET_N(0);
    SET_H(0);
    SET_C(msb);
}